

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  double *field;
  uint field_00;
  float fVar1;
  ulong uVar2;
  uint32 *has_bits_array;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < num_fields) {
    uVar2 = (ulong)(uint)num_fields;
  }
  do {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return;
    }
    field_00 = field_metadata_table->type;
    if (100 < field_00) {
switchD_0019dc97_caseD_12:
      SerializeNotImplemented(field_00);
      goto LAB_0019e3dc;
    }
    field = (double *)(base + field_metadata_table->offset);
    switch(field_00) {
    case 0:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e0af:
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 1:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e0ec:
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 2:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e2ee:
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 3:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e01d:
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 4:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019e08e;
    case 5:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019dfcc:
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 6:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019e17a;
    case 7:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019df61:
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 8:
    case 0xb:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019dce8:
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 9:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e1a5:
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 10:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e122:
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0xc:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019e1d8;
    case 0xd:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019e075;
    case 0xe:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019de62;
    case 0xf:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e22f:
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x10:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0019e242;
    case 0x11:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0019e338:
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    default:
      goto switchD_0019dc97_caseD_12;
    case 0x14:
      if ((*field != 0.0) || (NAN(*field))) goto LAB_0019e0af;
      break;
    case 0x15:
      if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_0019e0ec;
      break;
    case 0x16:
      if (*field != 0.0) goto LAB_0019e2ee;
      break;
    case 0x17:
      if (*field != 0.0) goto LAB_0019e01d;
      break;
    case 0x18:
      fVar1 = *(float *)field;
joined_r0x0019e08e:
      if (fVar1 != 0.0) {
LAB_0019e3c8:
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x19:
      if (*field != 0.0) goto LAB_0019dfcc;
      break;
    case 0x1a:
      fVar1 = *(float *)field;
joined_r0x0019e17a:
      if (fVar1 != 0.0) {
LAB_0019e180:
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x1b:
      if (*(char *)field != '\0') goto LAB_0019df61;
      break;
    case 0x1c:
    case 0x1f:
      if (*(long *)(((ulong)*field & 0xfffffffffffffffe) + 8) != 0) goto LAB_0019dce8;
      break;
    case 0x1d:
      if (*field != 0.0) goto LAB_0019e1a5;
      break;
    case 0x1e:
      if (*field != 0.0) goto LAB_0019e122;
      break;
    case 0x20:
      fVar1 = *(float *)field;
joined_r0x0019e1d8:
      if (fVar1 != 0.0) {
LAB_0019e1de:
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x21:
      fVar1 = *(float *)field;
joined_r0x0019e075:
      if (fVar1 != 0.0) {
LAB_0019e07b:
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x22:
      fVar1 = *(float *)field;
joined_r0x0019de62:
      if (fVar1 != 0.0) {
LAB_0019e383:
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x23:
      if (*field != 0.0) goto LAB_0019e22f;
      break;
    case 0x24:
      fVar1 = *(float *)field;
joined_r0x0019e242:
      if (fVar1 != 0.0) {
LAB_0019e294:
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x25:
      if (*field != 0.0) goto LAB_0019e338;
      break;
    case 0x28:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x29:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2a:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2b:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2c:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2d:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2e:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2f:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x30:
    case 0x33:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x31:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x32:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x34:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x35:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x36:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x37:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x38:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x39:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3c:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3d:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3e:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3f:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x40:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x41:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x42:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x43:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x48:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x49:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4a:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4b:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4c:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4d:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x50:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e0af;
      break;
    case 0x51:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e0ec;
      break;
    case 0x52:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e2ee;
      break;
    case 0x53:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e01d;
      break;
    case 0x54:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e3c8;
    case 0x55:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019dfcc;
      break;
    case 0x56:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e180;
    case 0x57:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019df61;
      break;
    case 0x58:
    case 0x5b:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019dce8;
      break;
    case 0x59:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e1a5;
      break;
    case 0x5a:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e122;
      break;
    case 0x5c:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e1de;
    case 0x5d:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e07b;
    case 0x5e:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e383;
    case 0x5f:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e22f;
      break;
    case 0x60:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0019e294;
    case 0x61:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0019e338;
      break;
    case 100:
      (*(code *)field_metadata_table->ptr)
                (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                 field_metadata_table->has_offset,output);
    }
LAB_0019e3dc:
    field_metadata_table = field_metadata_table + 1;
  } while( true );
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}